

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_skip(archive_read *a)

{
  int64_t iVar1;
  long in_RDI;
  ar *ar;
  int64_t bytes_skipped;
  int64_t in_stack_ffffffffffffffd8;
  archive_read *a_00;
  int local_4;
  
  a_00 = (archive_read *)**(undefined8 **)(in_RDI + 0x948);
  iVar1 = __archive_read_consume(a_00,in_stack_ffffffffffffffd8);
  if (iVar1 < 0) {
    local_4 = -0x1e;
  }
  else {
    (a_00->archive).magic = 0;
    (a_00->archive).state = 0;
    (a_00->archive).vtable = (archive_vtable_conflict *)0x0;
    (a_00->archive).archive_format_name = (char *)0x0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_ar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct ar* ar;

	ar = (struct ar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    ar->entry_bytes_remaining + ar->entry_padding
	    + ar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	ar->entry_bytes_remaining = 0;
	ar->entry_bytes_unconsumed = 0;
	ar->entry_padding = 0;

	return (ARCHIVE_OK);
}